

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim_rpc.hpp
# Opt level: O2

Object * __thiscall
nvim::NvimRPC::do_call<>(Object *__return_storage_ptr__,NvimRPC *this,string *method)

{
  unsigned_long d;
  packer<msgpack::v1::sbuffer> *this_00;
  size_t in_RCX;
  Packer pk;
  sbuffer sbuf;
  unpacked result;
  object obj;
  tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  dst;
  
  msgpack::v1::sbuffer::sbuffer(&sbuf,0x2000);
  pk.m_stream = &sbuf;
  this_00 = msgpack::v1::packer<msgpack::v1::sbuffer>::pack_array(&pk,4);
  msgpack::v1::packer<msgpack::v1::sbuffer>::pack_imp_uint64<unsigned_long>(this_00,0);
  d = this->msgid_;
  this->msgid_ = d + 1;
  msgpack::v1::packer<msgpack::v1::sbuffer>::pack_imp_uint64<unsigned_long>(this_00,d);
  msgpack::v1::operator<<(this_00,method);
  msgpack::v1::packer<msgpack::v1::sbuffer>::pack_array(&pk,0);
  Socket::write(&this->socket_,(int)sbuf.m_data,(void *)sbuf.m_size,in_RCX);
  Socket::read2(&result,&this->socket_,5.0);
  dst.
  super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
  ._M_head_impl.super_variant<_cf2d41c5_>.which_ = 0;
  obj.super_object.via.array.ptr = result.m_obj.super_object.via.array.ptr;
  dst.
  super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Head_base<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
  ._M_head_impl.super_variant<_cf2d41c5_>.which_ = 0;
  obj.super_object.type = result.m_obj.super_object.type;
  obj.super_object._4_4_ = result.m_obj.super_object._4_4_;
  obj.super_object.via.u64 = result.m_obj.super_object.via.u64;
  dst.
  super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .super__Head_base<1UL,_long,_false>._M_head_impl = 0;
  dst.
  super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .super__Head_base<0UL,_long,_false>._M_head_impl = 0;
  msgpack::v1::object::
  convert<msgpack::v1::type::tuple<long,long,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>>
            (&obj.super_object,&dst);
  boost::variant<$cf2d41c5$>::variant
            (&__return_storage_ptr__->super_variant<_cf2d41c5_>,(variant<_cf2d41c5_> *)&dst);
  std::
  _Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  ::~_Tuple_impl((_Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
                  *)&dst);
  std::unique_ptr<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>::~unique_ptr
            (&result.m_zone);
  free(sbuf.m_data);
  return __return_storage_ptr__;
}

Assistant:

Object NvimRPC::do_call(const std::string &method, const U&...u) {
    msgpack::sbuffer sbuf;
    detail::Packer pk(&sbuf);
    pk.pack_array(4) << (uint64_t)REQUEST
                     << msgid_++
                     << method;

    pk.pack_array(sizeof...(u));
    detail::pack(pk, u...);

    // msgpack::object_handle oh = msgpack::unpack(sbuf.data(), sbuf.size());
    // msgpack::object deserialized = oh.get();
    // std::cout << "sbuf = " << deserialized << std::endl;

    socket_.write(sbuf.data(), sbuf.size(), 5);

    msgpack::unpacked result = socket_.read2(5);
    msgpack::object obj(result.get());

    //TODO: full-state response handler should be implemented

    // std::cout << "res = " << obj << std::endl;
    msgpack::type::tuple<int64_t, int64_t, Object, Object> dst;
    // [type=1, msgid(uint), error(str?), result(...)]
    obj.convert(dst);
    return dst.get<3>();
}